

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  int size;
  int iVar1;
  type tVar2;
  appender aVar3;
  int num_digits;
  char digits [40];
  int local_88;
  uint local_84;
  basic_format_specs<char> *local_80;
  anon_class_32_4_dca7119b local_78;
  char local_58 [40];
  
  local_84 = prefix;
  local_80 = specs;
  size = do_count_digits(value);
  local_88 = size;
  format_decimal<char,unsigned_long>(local_58,value,size);
  iVar1 = digit_grouping<char>::count_separators(grouping,size);
  tVar2 = to_unsigned<int>(((size + 1) - (uint)(prefix == 0)) + iVar1);
  local_78.prefix = &local_84;
  local_78.grouping = grouping;
  local_78.digits = &local_58;
  local_78.num_digits = &local_88;
  aVar3 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::digit_grouping<char>const&)::_lambda(fmt::v8::appender)_1_>
                    (out,local_80,(ulong)tVar2,(ulong)tVar2,&local_78);
  return (appender)aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}